

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O1

SmartPtr<Event> * __thiscall SmartPtr<Event>::operator=(SmartPtr<Event> *this,Event *obj)

{
  int *piVar1;
  
  if (obj != (Event *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
    piVar1 = &(obj->super_RefCount).mRefCount;
    *piVar1 = *piVar1 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  }
  if (this->mObj != (Event *)0x0) {
    RefCount::Release(&this->mObj->super_RefCount);
  }
  this->mObj = obj;
  return this;
}

Assistant:

SmartPtr &operator=( T *obj )	
	{ 
		//printf( "SmartPtr = start\n" );
		if ( obj != NULL)
		{
			obj->AddRef();
		}

		if ( mObj != NULL )
			mObj->Release();
		mObj = obj;
		
		//printf( "SmartPtr = stop\n" );
		return *this;
	}